

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_matrix.h
# Opt level: O0

bool __thiscall xray_re::_matrix<float>::is_identity(_matrix<float> *this)

{
  float fVar1;
  bool local_11;
  _matrix<float> *this_local;
  
  fVar1 = (this->field_0).field_0._11;
  local_11 = false;
  if ((fVar1 == 1.0) && (!NAN(fVar1))) {
    fVar1 = (this->field_0).field_0._12;
    local_11 = false;
    if ((fVar1 == 0.0) && (!NAN(fVar1))) {
      fVar1 = (this->field_0).field_0._13;
      local_11 = false;
      if ((fVar1 == 0.0) && (!NAN(fVar1))) {
        fVar1 = (this->field_0).field_0._14;
        local_11 = false;
        if ((fVar1 == 0.0) && (!NAN(fVar1))) {
          fVar1 = (this->field_0).field_0._21;
          local_11 = false;
          if ((fVar1 == 0.0) && (!NAN(fVar1))) {
            fVar1 = (this->field_0).field_0._22;
            local_11 = false;
            if ((fVar1 == 1.0) && (!NAN(fVar1))) {
              fVar1 = (this->field_0).field_0._23;
              local_11 = false;
              if ((fVar1 == 0.0) && (!NAN(fVar1))) {
                fVar1 = (this->field_0).field_0._24;
                local_11 = false;
                if ((fVar1 == 0.0) && (!NAN(fVar1))) {
                  fVar1 = (this->field_0).field_0._31;
                  local_11 = false;
                  if ((fVar1 == 0.0) && (!NAN(fVar1))) {
                    fVar1 = (this->field_0).field_0._32;
                    local_11 = false;
                    if ((fVar1 == 0.0) && (!NAN(fVar1))) {
                      fVar1 = (this->field_0).field_0._33;
                      local_11 = false;
                      if ((fVar1 == 1.0) && (!NAN(fVar1))) {
                        fVar1 = (this->field_0).field_0._34;
                        local_11 = false;
                        if ((fVar1 == 0.0) && (!NAN(fVar1))) {
                          fVar1 = (this->field_0).field_0._41;
                          local_11 = false;
                          if ((fVar1 == 0.0) && (!NAN(fVar1))) {
                            fVar1 = (this->field_0).field_0._42;
                            local_11 = false;
                            if ((fVar1 == 0.0) && (!NAN(fVar1))) {
                              fVar1 = (this->field_0).field_0._43;
                              local_11 = false;
                              if ((fVar1 == 0.0) && (!NAN(fVar1))) {
                                local_11 = (this->field_0).field_0._44 == 1.0;
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return local_11;
}

Assistant:

inline bool _matrix<T>::is_identity() const
{
	return _11 == 1 && _12 == 0 && _13 == 0 && _14 == 0 &&
			_21 == 0 && _22 == 1 && _23 == 0 && _24 == 0 &&
			_31 == 0 && _32 == 0 && _33 == 1 && _34 == 0 &&
			_41 == 0 && _42 == 0 && _43 == 0 && _44 == 1;
}